

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

MD5_context * Curl_MD5_init(MD5_params *md5params)

{
  CURLcode CVar1;
  MD5_context *pMVar2;
  void *pvVar3;
  
  pMVar2 = (MD5_context *)(*Curl_cmalloc)(0x10);
  if (pMVar2 != (MD5_context *)0x0) {
    pvVar3 = (*Curl_cmalloc)((size_t)md5params->md5_ctxtsize);
    pMVar2->md5_hashctx = pvVar3;
    if (pvVar3 != (void *)0x0) {
      pMVar2->md5_hash = md5params;
      CVar1 = (*md5params->md5_init_func)(pvVar3);
      if (CVar1 == CURLE_OK) {
        return pMVar2;
      }
      (*Curl_cfree)(pMVar2->md5_hashctx);
    }
    (*Curl_cfree)(pMVar2);
  }
  return (MD5_context *)0x0;
}

Assistant:

struct MD5_context *Curl_MD5_init(const struct MD5_params *md5params)
{
  struct MD5_context *ctxt;

  /* Create MD5 context */
  ctxt = malloc(sizeof(*ctxt));

  if(!ctxt)
    return ctxt;

  ctxt->md5_hashctx = malloc(md5params->md5_ctxtsize);

  if(!ctxt->md5_hashctx) {
    free(ctxt);
    return NULL;
  }

  ctxt->md5_hash = md5params;

  if((*md5params->md5_init_func)(ctxt->md5_hashctx)) {
    free(ctxt->md5_hashctx);
    free(ctxt);
    return NULL;
  }

  return ctxt;
}